

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O1

void __thiscall
QDBusMenuAdaptor::Event
          (QDBusMenuAdaptor *this,int id,QString *eventId,QDBusVariant *data,uint timestamp)

{
  char cVar1;
  QDBusPlatformMenuItem *this_00;
  QLoggingCategory *pQVar2;
  char16_t *pcVar3;
  QPlatformMenu *this_01;
  QArrayData *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  int in_stack_ffffffffffffff8c;
  QDebug local_58;
  QArrayData *local_50;
  char16_t *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QDBusPlatformMenuItem::byId(in_stack_ffffffffffffff8c);
  pQVar2 = QtPrivateLogging::qLcMenu();
  if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    QTextStream::operator<<(&(local_58.stream)->ts,id);
    if ((local_58.stream)->space == true) {
      QTextStream::operator<<(&(local_58.stream)->ts,' ');
    }
    if (this_00 == (QDBusPlatformMenuItem *)0x0) {
      QVar5.m_data = (storage_type *)0x0;
      QVar5.m_size = (qsizetype)&local_50;
      QString::fromLatin1(QVar5);
      pQVar4 = local_50;
    }
    else {
      pQVar4 = &((this_00->m_text).d.d)->super_QArrayData;
      local_48 = (this_00->m_text).d.ptr;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQVar4->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (local_48 == (char16_t *)0x0) {
      local_48 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_58,(ulong)local_48);
    if ((local_58.stream)->space == true) {
      QTextStream::operator<<(&(local_58.stream)->ts,' ');
    }
    pcVar3 = (eventId->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_58,(ulong)pcVar3);
    if ((local_58.stream)->space == true) {
      QTextStream::operator<<(&(local_58.stream)->ts,' ');
    }
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    QDebug::~QDebug(&local_58);
  }
  if (this_00 != (QDBusPlatformMenuItem *)0x0) {
    if ((eventId->d).size == 7) {
      QVar6.m_data = (eventId->d).ptr;
      QVar6.m_size = 7;
      QVar9.m_data = "clicked";
      QVar9.m_size = 7;
      cVar1 = QtPrivate::equalStrings(QVar6,QVar9);
      if (cVar1 != '\0') {
        QDBusPlatformMenuItem::trigger((QDBusPlatformMenuItem *)this_00);
      }
    }
    if ((this_00 != (QDBusPlatformMenuItem *)0x0) && ((eventId->d).size == 7)) {
      QVar7.m_data = (eventId->d).ptr;
      QVar7.m_size = 7;
      QVar10.m_data = "hovered";
      QVar10.m_size = 7;
      cVar1 = QtPrivate::equalStrings(QVar7,QVar10);
      if (cVar1 != '\0') {
        QPlatformMenuItem::hovered(&this_00->super_QPlatformMenuItem);
      }
    }
  }
  if ((eventId->d).size == 6) {
    QVar8.m_data = (eventId->d).ptr;
    QVar8.m_size = 6;
    QVar11.m_data = "closed";
    QVar11.m_size = 6;
    cVar1 = QtPrivate::equalStrings(QVar8,QVar11);
    if (cVar1 != '\0') {
      if (this_00 == (QDBusPlatformMenuItem *)0x0) {
        if (id == 0) {
          this_01 = *(QPlatformMenu **)(this + 0x10);
        }
        else {
          this_01 = (QPlatformMenu *)0x0;
        }
      }
      else {
        this_01 = this_00->m_subMenu;
      }
      if (this_01 != (QPlatformMenu *)0x0) {
        QPlatformMenu::aboutToHide(this_01);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuAdaptor::Event(int id, const QString &eventId, const QDBusVariant &data, uint timestamp)
{
    Q_UNUSED(data);
    Q_UNUSED(timestamp);
    QDBusPlatformMenuItem *item = QDBusPlatformMenuItem::byId(id);
    qCDebug(qLcMenu) << id << (item ? item->text() : ""_L1) << eventId;
    if (item && eventId == "clicked"_L1)
        item->trigger();
    if (item && eventId == "hovered"_L1)
        emit item->hovered();
    if (eventId == "closed"_L1) {
        // There is no explicit AboutToHide method, so map closed event to aboutToHide method
        const QDBusPlatformMenu *menu = nullptr;
        if (item)
            menu = static_cast<const QDBusPlatformMenu *>(item->menu());
        else if (id == 0)
            menu = m_topLevelMenu;
        if (menu)
            emit const_cast<QDBusPlatformMenu *>(menu)->aboutToHide();
    }
}